

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.cpp
# Opt level: O0

void FileUtils::showInGraphicalShell(QWidget *parent,QString *pathIn)

{
  qsizetype *pqVar1;
  bool bVar2;
  byte bVar3;
  QList<QString> *pQVar4;
  QSettings *settings;
  QByteArrayView QVar5;
  bool local_3d1;
  QByteArray local_380;
  undefined1 local_368 [8];
  QString error;
  QList<QString> local_338;
  bool local_311;
  undefined1 local_310 [7];
  bool success;
  QString browserArgs;
  QProcess browserProc;
  undefined1 local_2e8 [8];
  QString app;
  QString folder;
  QString local_2a8;
  QLatin1String local_290;
  QString local_280;
  QLatin1String local_268;
  QString local_258;
  QLatin1String local_240;
  QString local_230;
  QLatin1Char local_213;
  QChar local_212;
  QString local_210;
  QByteArrayView local_1f8;
  QString local_1e8;
  QString local_1d0;
  QLatin1String local_1b8;
  QString local_1a8;
  undefined1 local_190 [8];
  QStringList scriptArgs;
  QString local_160;
  QString local_148;
  QString local_130;
  QLatin1String local_118;
  QString local_108;
  undefined1 local_f0 [8];
  QStringList param;
  QString local_d0;
  QString local_b8;
  QLatin1String local_a0;
  QString local_90;
  Environment local_68;
  QString local_50;
  undefined1 local_38 [8];
  FileName explorer;
  QFileInfo fileInfo;
  QString *pathIn_local;
  QWidget *parent_local;
  
  QFileInfo::QFileInfo((QFileInfo *)&explorer.super_QString.d.size,pathIn);
  bVar2 = HostOsInfo::isWindowsHost();
  if (bVar2) {
    Environment::systemEnvironment();
    QLatin1String::QLatin1String(&local_a0,"explorer.exe");
    QString::QString(&local_90,local_a0);
    Environment::searchInPath(&local_50,&local_68,&local_90);
    FileName::FileName((FileName *)local_38,&local_50);
    QString::~QString(&local_50);
    QString::~QString(&local_90);
    Environment::~Environment(&local_68);
    bVar2 = QString::isEmpty((QString *)local_38);
    if (bVar2) {
      QCoreApplication::translate
                ((char *)&local_b8,"Core::Internal","Launching Windows Explorer Failed",0);
      QCoreApplication::translate
                ((char *)&local_d0,"Core::Internal",
                 "Could not find explorer.exe in path to launch Windows Explorer.",0);
      QFlags<QMessageBox::StandardButton>::QFlags
                ((QFlags<QMessageBox::StandardButton> *)((long)&param.d.size + 4),FirstButton);
      QMessageBox::warning
                (parent,&local_b8,&local_d0,(QFlags_conflict1 *)(ulong)param.d.size._4_4_,NoButton);
      QString::~QString(&local_d0);
      QString::~QString(&local_b8);
      param.d.size._0_4_ = 1;
    }
    else {
      QList<QString>::QList((QList<QString> *)local_f0);
      bVar3 = QFileInfo::isDir();
      if ((bVar3 & 1) == 0) {
        QLatin1String::QLatin1String(&local_118,"/select,");
        QString::QString(&local_108,local_118);
        QList<QString>::operator+=((QList<QString> *)local_f0,&local_108);
        QString::~QString(&local_108);
      }
      QFileInfo::canonicalFilePath();
      QDir::toNativeSeparators(&local_130);
      QList<QString>::operator+=((QList<QString> *)local_f0,&local_130);
      QString::~QString(&local_130);
      QString::~QString(&local_148);
      FileName::toString(&local_160,(FileName *)local_38);
      pqVar1 = &scriptArgs.d.size;
      QString::QString((QString *)pqVar1);
      QProcess::startDetached
                (&local_160,(QList_conflict2 *)local_f0,(QString *)pqVar1,(longlong *)0x0);
      QString::~QString((QString *)&scriptArgs.d.size);
      QString::~QString(&local_160);
      QList<QString>::~QList((QList<QString> *)local_f0);
      param.d.size._0_4_ = 0;
    }
    FileName::~FileName((FileName *)local_38);
    if ((int)param.d.size != 0) goto LAB_001482a3;
  }
  else {
    bVar2 = HostOsInfo::isMacHost();
    if (bVar2) {
      QList<QString>::QList((QList<QString> *)local_190);
      QLatin1String::QLatin1String(&local_1b8,"-e");
      QString::QString(&local_1a8,local_1b8);
      pQVar4 = QList<QString>::operator<<((QList<QString> *)local_190,&local_1a8);
      QByteArrayView::QByteArrayView<52ul>
                (&local_1f8,(char (*) [52])"tell application \"Finder\" to reveal POSIX file \"%1\""
                );
      QVar5.m_data = (storage_type *)local_1f8.m_size;
      QVar5.m_size = (qsizetype)&local_1e8;
      QString::fromLatin1(QVar5);
      QFileInfo::canonicalFilePath();
      QLatin1Char::QLatin1Char(&local_213,' ');
      QChar::QChar(&local_212,local_213);
      QString::arg(&local_1d0,(int)&local_1e8,(QChar *)&local_210);
      QList<QString>::operator<<(pQVar4,&local_1d0);
      QString::~QString(&local_1d0);
      QString::~QString(&local_210);
      QString::~QString(&local_1e8);
      QString::~QString(&local_1a8);
      QLatin1String::QLatin1String(&local_240,"/usr/bin/osascript");
      QString::QString(&local_230,local_240);
      QProcess::execute(&local_230,(QList_conflict2 *)local_190);
      QString::~QString(&local_230);
      QList<QString>::clear((QList<QString> *)local_190);
      QLatin1String::QLatin1String(&local_268,"-e");
      QString::QString(&local_258,local_268);
      pQVar4 = QList<QString>::operator<<((QList<QString> *)local_190,&local_258);
      QLatin1String::QLatin1String(&local_290,"tell application \"Finder\" to activate");
      QString::QString(&local_280,local_290);
      QList<QString>::operator<<(pQVar4,&local_280);
      QString::~QString(&local_280);
      QString::~QString(&local_258);
      QLatin1String::QLatin1String((QLatin1String *)&folder.d.size,"/usr/bin/osascript");
      QString::QString(&local_2a8,stack0xfffffffffffffd48);
      QProcess::execute(&local_2a8,(QList_conflict2 *)local_190);
      QString::~QString(&local_2a8);
      QList<QString>::~QList((QList<QString> *)local_190);
    }
    else {
      bVar3 = QFileInfo::isDir();
      if ((bVar3 & 1) == 0) {
        QFileInfo::filePath();
      }
      else {
        QFileInfo::absoluteFilePath();
      }
      settings = ICore::settings();
      UnixUtils::fileBrowser((QString *)local_2e8,settings);
      QProcess::QProcess((QProcess *)&browserArgs.d.size,(QObject *)0x0);
      UnixUtils::substituteFileBrowserParameters
                ((QString *)local_310,(QString *)local_2e8,(QString *)&app.d.size);
      local_338.d.d = (Data *)0x0;
      local_338.d.ptr = (QString *)0x0;
      local_338.d.size = 0;
      QList<QString>::QList(&local_338);
      pqVar1 = &error.d.size;
      QString::QString((QString *)pqVar1);
      bVar3 = QProcess::startDetached
                        ((QString *)local_310,(QList_conflict2 *)&local_338,(QString *)pqVar1,
                         (longlong *)0x0);
      QString::~QString((QString *)&error.d.size);
      QList<QString>::~QList(&local_338);
      local_311 = (bool)(bVar3 & 1);
      QProcess::readAllStandardError();
      QString::fromLocal8Bit<void>((QString *)local_368,&local_380);
      QByteArray::~QByteArray(&local_380);
      local_3d1 = false;
      if ((local_311 & 1U) != 0) {
        local_3d1 = QString::isEmpty((QString *)local_368);
      }
      local_311 = local_3d1;
      if (local_3d1 == false) {
        showGraphicalShellError(parent,(QString *)local_2e8,(QString *)local_368);
      }
      QString::~QString((QString *)local_368);
      QString::~QString((QString *)local_310);
      QProcess::~QProcess((QProcess *)&browserArgs.d.size);
      QString::~QString((QString *)local_2e8);
      QString::~QString((QString *)&app.d.size);
    }
  }
  param.d.size._0_4_ = 0;
LAB_001482a3:
  QFileInfo::~QFileInfo((QFileInfo *)&explorer.super_QString.d.size);
  return;
}

Assistant:

void FileUtils::showInGraphicalShell(QWidget *parent, const QString &pathIn)
{

    const QFileInfo fileInfo(pathIn);

    // Mac, Windows support folder or file.
    if (HostOsInfo::isWindowsHost()) {
        const FileName explorer = Environment::systemEnvironment().searchInPath(QLatin1String("explorer.exe"));
        if (explorer.isEmpty()) {
            QMessageBox::warning(parent,
                                 QApplication::translate("Core::Internal",
                                                         "Launching Windows Explorer Failed"),
                                 QApplication::translate("Core::Internal",
                                                         "Could not find explorer.exe in path to launch Windows Explorer."));
            return;
        }
        QStringList param;
        if (!fileInfo.isDir())
            param += QLatin1String("/select,");
        param += QDir::toNativeSeparators(fileInfo.canonicalFilePath());
        QProcess::startDetached(explorer.toString(), param);
    } else if (HostOsInfo::isMacHost()) {
        QStringList scriptArgs;
        scriptArgs << QLatin1String("-e")
                   << QString::fromLatin1("tell application \"Finder\" to reveal POSIX file \"%1\"")
                                         .arg(fileInfo.canonicalFilePath());
        QProcess::execute(QLatin1String("/usr/bin/osascript"), scriptArgs);
        scriptArgs.clear();
        scriptArgs << QLatin1String("-e")
                   << QLatin1String("tell application \"Finder\" to activate");
        QProcess::execute(QLatin1String("/usr/bin/osascript"), scriptArgs);
    } else {
        // we cannot select a file here, because no file browser really supports it...
        const QString folder = fileInfo.isDir() ? fileInfo.absoluteFilePath() : fileInfo.filePath();
        const QString app = UnixUtils::fileBrowser(ICore::settings());
        QProcess browserProc;
        const QString browserArgs = UnixUtils::substituteFileBrowserParameters(app, folder);
        bool success = browserProc.startDetached(browserArgs);
        const QString error = QString::fromLocal8Bit(browserProc.readAllStandardError());
        success = success && error.isEmpty();
        if (!success)
            showGraphicalShellError(parent, app, error);
    }
}